

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall ghc::filesystem::path::filename(path *__return_storage_ptr__,path *this)

{
  bool bVar1;
  iterator *this_00;
  reference p;
  iterator local_78;
  path local_38;
  path *local_18;
  path *this_local;
  
  local_18 = this;
  this_local = __return_storage_ptr__;
  relative_path(&local_38,this);
  bVar1 = empty(&local_38);
  if (bVar1) {
    path(__return_storage_ptr__);
  }
  else {
    end(&local_78,this);
    this_00 = iterator::operator--(&local_78);
    p = iterator::operator*(this_00);
    path(__return_storage_ptr__,p);
    iterator::~iterator(&local_78);
  }
  ~path(&local_38);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::filename() const
{
    return relative_path().empty() ? path() : path(*--end());
}